

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  ReporterConfig *in_RDI;
  CumulativeReporterBase *unaff_retaddr;
  ReporterConfig *os;
  
  os = in_RDI;
  CumulativeReporterBase::CumulativeReporterBase(unaff_retaddr,in_RDI);
  (in_RDI->m_stream).m_ptr = (IStream *)&PTR__JunitReporter_002a6a10;
  XmlWriter::XmlWriter((XmlWriter *)unaff_retaddr,(ostream *)os);
  Timer::Timer((Timer *)&in_RDI[3].m_customOptions._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[3].m_customOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::__cxx11::string::string((string *)(in_RDI + 4));
  in_RDI[4].m_customOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  in_RDI[4].m_customOptions._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = 0;
  *(undefined1 *)&in_RDI->m_fullConfig = 1;
  *(undefined1 *)((long)&in_RDI->m_fullConfig + 1) = 1;
  *(undefined1 *)&in_RDI[1].m_customOptions._M_t._M_impl = 0;
  return;
}

Assistant:

JunitReporter::JunitReporter( ReporterConfig&& _config )
        :   CumulativeReporterBase( CATCH_MOVE(_config) ),
            xml( m_stream )
        {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
            m_shouldStoreSuccesfulAssertions = false;
        }